

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_parse_pubkey(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uchar *end;
  uchar *p;
  size_t len;
  uchar *local_30;
  size_t local_28;
  
  end = key + keylen;
  local_30 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_30,end,&local_28,0x30);
  if (((iVar1 == 0) && (iVar4 = -0x4080, iVar1 = iVar4, end == local_30 + local_28)) &&
     (iVar1 = mbedtls_asn1_get_tag(&local_30,end,&local_28,2), iVar1 == 0)) {
    if (local_30 != (uchar *)0x0) {
      iVar1 = mbedtls_mpi_read_binary(&rsa->N,local_30,local_28);
      if (iVar1 != 0x4080) {
        if (iVar1 != 0) {
          return -0x4080;
        }
        sVar3 = mbedtls_mpi_size(&rsa->N);
        rsa->len = sVar3;
      }
    }
    local_30 = local_30 + local_28;
    iVar1 = mbedtls_asn1_get_tag(&local_30,end,&local_28,2);
    if ((iVar1 == 0) &&
       (((local_30 == (uchar *)0x0 ||
         (iVar2 = mbedtls_mpi_read_binary(&rsa->E,local_30,local_28), iVar2 == 0x4080)) ||
        (iVar1 = iVar4, iVar2 == 0)))) {
      local_30 = local_30 + local_28;
      iVar2 = mbedtls_rsa_complete(rsa);
      iVar1 = iVar4;
      if (((iVar2 == 0) && (iVar2 = mbedtls_rsa_check_pubkey(rsa), iVar2 == 0)) &&
         (iVar1 = -0x66, local_30 == end)) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_parse_pubkey(mbedtls_rsa_context *rsa, const unsigned char *key, size_t keylen)
{
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = (unsigned char *) (key + keylen);
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /*
     *  RSAPublicKey ::= SEQUENCE {
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER   -- e
     *  }
     */

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (end != p + len) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /* Import N */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_rsa_import_raw(rsa, p, len, NULL, 0, NULL, 0,
                                      NULL, 0, NULL, 0)) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    p += len;

    /* Import E */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_rsa_import_raw(rsa, NULL, 0, NULL, 0, NULL, 0,
                                      NULL, 0, p, len)) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    p += len;

    if (mbedtls_rsa_complete(rsa) != 0 ||
        mbedtls_rsa_check_pubkey(rsa) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}